

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

LexerState * raviX_init_lexer(CompilerState *compiler_state,char *buf,size_t buflen,char *source)

{
  CompilerState *compiler_state_00;
  char *__s;
  uint uVar1;
  LexerState *pLVar2;
  StringObject *pSVar3;
  size_t sVar4;
  long lVar5;
  
  pLVar2 = (LexerState *)raviX_calloc(1,0x70);
  pLVar2->compiler_state = compiler_state;
  (pLVar2->t).token = 0;
  pLVar2->buf = buf;
  pLVar2->bufsize = buflen;
  pLVar2->p = buf;
  pLVar2->n = buflen - 1;
  uVar1 = 0xffffffff;
  if (buflen != 0) {
    pLVar2->p = buf + 1;
    uVar1 = (uint)(byte)*buf;
  }
  pLVar2->current = uVar1;
  (pLVar2->lookahead).token = 300;
  pLVar2->linenumber = 1;
  pLVar2->lastline = 1;
  pLVar2->source = source;
  pSVar3 = raviX_create_string(compiler_state,"_ENV",4);
  pLVar2->envn = pSVar3->str;
  pLVar2->buff = &compiler_state->buff;
  lVar5 = 0;
  do {
    compiler_state_00 = pLVar2->compiler_state;
    __s = *(char **)((long)luaX_tokens + lVar5);
    sVar4 = strlen(__s);
    raviX_create_string(compiler_state_00,__s,(uint32_t)sVar4);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0xd0);
  return pLVar2;
}

Assistant:

LexerState *raviX_init_lexer(CompilerState *compiler_state, const char *buf, size_t buflen,
				     const char *source)
{
	LexerState *ls = (LexerState *)raviX_calloc(1, sizeof(LexerState));
	ls->compiler_state = compiler_state;
	ls->t.token = 0;
	ls->buf = buf;
	ls->bufsize = buflen;
	ls->n = ls->bufsize;
	ls->p = ls->buf;
	ls->current = zgetc(ls);
	ls->lookahead.token = TOK_EOS; /* no look-ahead token */
	ls->linenumber = 1;
	ls->lastline = 1;
	ls->source = source;
	ls->envn = raviX_create_string(ls->compiler_state, LUA_ENV, (uint32_t)strlen(LUA_ENV))->str; /* get env name */
	ls->buff = &compiler_state->buff;
	for (int i = 0; i < NUM_RESERVED; i++) {
		raviX_create_string(ls->compiler_state, luaX_tokens[i], (uint32_t)strlen(luaX_tokens[i]));
	}
	return ls;
}